

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

bool __thiscall ON_OBSOLETE_V5_DimExtra::CopyFrom(ON_OBSOLETE_V5_DimExtra *this,ON_Object *src)

{
  bool bVar1;
  long lVar2;
  ON_UserData *pOVar3;
  ON_UUID *pOVar4;
  ON_UserData *src_00;
  byte bVar5;
  
  bVar5 = 0;
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_UserData *)0x0;
  }
  else {
    bVar1 = ON_Object::IsKindOf(src,&m_ON_OBSOLETE_V5_DimExtra_class_rtti);
    src_00 = (ON_UserData *)0x0;
    if (bVar1) {
      src_00 = (ON_UserData *)src;
    }
  }
  if (src_00 != (ON_UserData *)0x0) {
    ON_UserData::operator=(&this->super_ON_UserData,src_00);
    pOVar3 = src_00 + 1;
    pOVar4 = &this->m_partent_uuid;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(_func_int ***)pOVar4 = (pOVar3->super_ON_Object)._vptr_ON_Object;
      pOVar3 = (ON_UserData *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
      pOVar4 = (ON_UUID *)pOVar4[-(ulong)bVar5].Data4;
    }
  }
  return src_00 != (ON_UserData *)0x0;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}